

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

LY_ERR parse_leaf(lysp_yang_ctx *ctx,lysp_node *parent,lysp_node **siblings)

{
  lysp_node *plVar1;
  undefined8 uVar2;
  LY_ERR LVar3;
  lysp_node *parent_00;
  char *pcVar4;
  ly_ctx *local_100;
  ly_ctx *local_f0;
  ly_ctx *local_d8;
  char *local_d0;
  ly_ctx *local_c0;
  ly_ctx *local_b8;
  ly_ctx *local_b0;
  LY_ERR ret___12;
  LY_ERR ret___11;
  LY_ERR ret___10;
  LY_ERR ret___9;
  LY_ERR ret___8;
  LY_ERR ret___7;
  LY_ERR ret___6;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  ly_bool __loop_end;
  long *plStack_70;
  LY_ERR ret__;
  char **iter__;
  size_t offset__;
  char *p__;
  lysp_node_leaf *leaf;
  size_t sStack_48;
  ly_stmt kw;
  size_t word_len;
  char *word;
  char *buf;
  lysp_node **pplStack_28;
  LY_ERR ret;
  lysp_node **siblings_local;
  lysp_node *parent_local;
  lysp_yang_ctx *ctx_local;
  
  buf._4_4_ = 0;
  pplStack_28 = siblings;
  siblings_local = &parent->parent;
  parent_local = (lysp_node *)ctx;
  parent_00 = (lysp_node *)calloc(1,0xd8);
  if (parent_00 == (lysp_node *)0x0) {
    if (parent_local == (lysp_node *)0x0) {
      local_b0 = (ly_ctx *)0x0;
    }
    else {
      local_b0 = *(ly_ctx **)
                  **(undefined8 **)
                    (parent_local->exts->argument +
                    (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
    }
    ly_log(local_b0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_leaf");
    return LY_EMEM;
  }
  if (*pplStack_28 == (lysp_node *)0x0) {
    *pplStack_28 = parent_00;
  }
  else {
    plVar1 = *pplStack_28;
    while (plStack_70 = (long *)((long)plVar1 + (long)*pplStack_28 + (0x10 - (long)*pplStack_28)),
          *plStack_70 != 0) {
      plVar1 = (lysp_node *)*plStack_70;
    }
    *plStack_70 = (long)parent_00;
  }
  parent_00->nodetype = 4;
  parent_00->parent = (lysp_node *)siblings_local;
  LVar3 = get_argument((lysp_yang_ctx *)parent_local,Y_IDENTIF_ARG,(uint16_t *)0x0,
                       (char **)&word_len,&word,&stack0xffffffffffffffb8);
  if (LVar3 != LY_SUCCESS) {
    return LVar3;
  }
  if (word == (char *)0x0) {
    if (parent_local == (lysp_node *)0x0) {
      local_c0 = (ly_ctx *)0x0;
    }
    else {
      local_c0 = *(ly_ctx **)
                  **(undefined8 **)
                    (parent_local->exts->argument +
                    (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
    }
    if (sStack_48 == 0) {
      local_d0 = "";
    }
    else {
      local_d0 = (char *)word_len;
    }
    buf._4_4_ = lydict_insert(local_c0,local_d0,sStack_48,&parent_00->name);
  }
  else {
    if (parent_local == (lysp_node *)0x0) {
      local_b8 = (ly_ctx *)0x0;
    }
    else {
      local_b8 = *(ly_ctx **)
                  **(undefined8 **)
                    (parent_local->exts->argument +
                    (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
    }
    buf._4_4_ = lydict_insert_zc(local_b8,(char *)word_len,&parent_00->name);
  }
  if (buf._4_4_ == LY_SUCCESS) {
    buf._4_4_ = 0;
    buf._4_4_ = get_keyword((lysp_yang_ctx *)parent_local,(ly_stmt *)((long)&leaf + 4),
                            (char **)&word_len,&stack0xffffffffffffffb8);
    if (buf._4_4_ == LY_SUCCESS) {
      if (leaf._4_4_ == LY_STMT_SYNTAX_SEMICOLON) {
        ret___2._3_1_ = 1;
        LVar3 = buf._4_4_;
      }
      else {
        if (leaf._4_4_ != LY_STMT_SYNTAX_LEFT_BRACE) {
          if (parent_local == (lysp_node *)0x0) {
            local_d8 = (ly_ctx *)0x0;
          }
          else {
            local_d8 = *(ly_ctx **)
                        **(undefined8 **)
                          (parent_local->exts->argument +
                          (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
          }
          pcVar4 = lyplg_ext_stmt2str(leaf._4_4_);
          ly_vlog(local_d8,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar4);
          return LY_EVALID;
        }
        LVar3 = get_keyword((lysp_yang_ctx *)parent_local,(ly_stmt *)((long)&leaf + 4),
                            (char **)&word_len,&stack0xffffffffffffffb8);
        if (LVar3 != LY_SUCCESS) {
          return LVar3;
        }
        ret___2._3_1_ = leaf._4_4_ == LY_STMT_SYNTAX_RIGHT_BRACE;
        LVar3 = LY_SUCCESS;
      }
      while (buf._4_4_ = LVar3, !(bool)ret___2._3_1_) {
        if (leaf._4_4_ == LY_STMT_CONFIG) {
          LVar3 = parse_config((lysp_yang_ctx *)parent_local,&parent_00->flags,&parent_00->exts);
joined_r0x001bf466:
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
        }
        else {
          if (leaf._4_4_ != LY_STMT_DEFAULT) {
            if (leaf._4_4_ == LY_STMT_DESCRIPTION) {
              LVar3 = parse_text_field((lysp_yang_ctx *)parent_local,parent_00->dsc,
                                       LY_STMT_DESCRIPTION,0,&parent_00->dsc,Y_STR_ARG,
                                       (uint16_t *)0x0,&parent_00->exts);
            }
            else if (leaf._4_4_ == LY_STMT_EXTENSION_INSTANCE) {
              LVar3 = parse_ext((lysp_yang_ctx *)parent_local,(char *)word_len,sStack_48,parent_00,
                                LY_STMT_LEAF,0,&parent_00->exts);
            }
            else {
              if (leaf._4_4_ != LY_STMT_IF_FEATURE) {
                if (leaf._4_4_ == LY_STMT_MANDATORY) {
                  LVar3 = parse_mandatory((lysp_yang_ctx *)parent_local,&parent_00->flags,
                                          &parent_00->exts);
                }
                else if (leaf._4_4_ == LY_STMT_MUST) {
                  LVar3 = parse_restrs((lysp_yang_ctx *)parent_local,LY_STMT_MUST,
                                       (lysp_restr **)(parent_00 + 1));
                }
                else if (leaf._4_4_ == LY_STMT_REFERENCE) {
                  LVar3 = parse_text_field((lysp_yang_ctx *)parent_local,parent_00->ref,
                                           LY_STMT_REFERENCE,0,&parent_00->ref,Y_STR_ARG,
                                           (uint16_t *)0x0,&parent_00->exts);
                }
                else if (leaf._4_4_ == LY_STMT_STATUS) {
                  LVar3 = parse_status((lysp_yang_ctx *)parent_local,&parent_00->flags,
                                       &parent_00->exts);
                }
                else if (leaf._4_4_ == LY_STMT_TYPE) {
                  LVar3 = parse_type((lysp_yang_ctx *)parent_local,(lysp_type *)&parent_00[1].next);
                }
                else if (leaf._4_4_ == LY_STMT_UNITS) {
                  LVar3 = parse_text_field((lysp_yang_ctx *)parent_local,parent_00[2].exts,
                                           LY_STMT_UNITS,0,(char **)&parent_00[2].exts,Y_STR_ARG,
                                           (uint16_t *)0x0,&parent_00->exts);
                }
                else {
                  if (leaf._4_4_ != LY_STMT_WHEN) {
                    if (parent_local == (lysp_node *)0x0) {
                      local_f0 = (ly_ctx *)0x0;
                    }
                    else {
                      local_f0 = *(ly_ctx **)
                                  **(undefined8 **)
                                    (parent_local->exts->argument +
                                    (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
                    }
                    pcVar4 = lyplg_ext_stmt2str(leaf._4_4_);
                    ly_vlog(local_f0,(char *)0x0,LYVE_SYNTAX_YANG,
                            "Invalid keyword \"%s\" as a child of \"%s\".",pcVar4,"leaf");
                    return LY_EVALID;
                  }
                  LVar3 = parse_when((lysp_yang_ctx *)parent_local,
                                     (lysp_when **)&parent_00[1].nodetype);
                }
                if (LVar3 != LY_SUCCESS) {
                  return LVar3;
                }
                goto LAB_001bf84a;
              }
              LVar3 = parse_qnames((lysp_yang_ctx *)parent_local,LY_STMT_IF_FEATURE,
                                   &parent_00->iffeatures,Y_STR_ARG,&parent_00->exts);
            }
            goto joined_r0x001bf466;
          }
          LVar3 = parse_text_field((lysp_yang_ctx *)parent_local,parent_00 + 3,LY_STMT_DEFAULT,0,
                                   (char **)(parent_00 + 3),Y_STR_ARG,(uint16_t *)&parent_00[3].next
                                   ,&parent_00->exts);
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
          uVar2 = *(undefined8 *)
                   (parent_local->exts->argument +
                   (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
          parent_00[3].nodetype = (short)uVar2;
          parent_00[3].flags = (short)((ulong)uVar2 >> 0x10);
          *(int *)&parent_00[3].field_0xc = (int)((ulong)uVar2 >> 0x20);
        }
LAB_001bf84a:
        buf._4_4_ = get_keyword((lysp_yang_ctx *)parent_local,(ly_stmt *)((long)&leaf + 4),
                                (char **)&word_len,&stack0xffffffffffffffb8);
        if (buf._4_4_ != LY_SUCCESS) {
          return buf._4_4_;
        }
        LVar3 = LY_SUCCESS;
        if (leaf._4_4_ == LY_STMT_SYNTAX_RIGHT_BRACE) {
          if ((parent_00->exts != (lysp_ext_instance *)0x0) &&
             (LVar3 = ly_set_add((ly_set *)&(parent_local[1].parent)->ref,parent_00->exts,'\x01',
                                 (uint32_t *)0x0), LVar3 != LY_SUCCESS)) {
            return LVar3;
          }
          buf._4_4_ = LVar3;
          ret___2._3_1_ = true;
          LVar3 = buf._4_4_;
        }
      }
      if (parent_00[1].next == (lysp_node *)0x0) {
        if (parent_local == (lysp_node *)0x0) {
          local_100 = (ly_ctx *)0x0;
        }
        else {
          local_100 = *(ly_ctx **)
                       **(undefined8 **)
                         (parent_local->exts->argument +
                         (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
        }
        ly_vlog(local_100,(char *)0x0,LYVE_SYNTAX_YANG,
                "Missing mandatory keyword \"%s\" as a child of \"%s\".","type","leaf");
        return LY_EVALID;
      }
    }
  }
  return buf._4_4_;
}

Assistant:

LY_ERR
parse_leaf(struct lysp_yang_ctx *ctx, struct lysp_node *parent, struct lysp_node **siblings)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_node_leaf *leaf;

    /* create new leaf structure */
    LY_LIST_NEW_RET(PARSER_CTX(ctx), siblings, leaf, next, LY_EMEM);
    leaf->nodetype = LYS_LEAF;
    leaf->parent = parent;

    /* get name */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, leaf->name, word, word_len, ret, cleanup);

    /* parse substatements */
    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(parse_config(ctx, &leaf->flags, &leaf->exts));
            break;
        case LY_STMT_DEFAULT:
            LY_CHECK_RET(parse_text_field(ctx, &leaf->dflt, LY_STMT_DEFAULT, 0, &leaf->dflt.str, Y_STR_ARG,
                    &leaf->dflt.flags, &leaf->exts));
            leaf->dflt.mod = PARSER_CUR_PMOD(ctx);
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, leaf->dsc, LY_STMT_DESCRIPTION, 0, &leaf->dsc, Y_STR_ARG, NULL, &leaf->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_IF_FEATURE, &leaf->iffeatures, Y_STR_ARG, &leaf->exts));
            break;
        case LY_STMT_MANDATORY:
            LY_CHECK_RET(parse_mandatory(ctx, &leaf->flags, &leaf->exts));
            break;
        case LY_STMT_MUST:
            LY_CHECK_RET(parse_restrs(ctx, kw, &leaf->musts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, leaf->ref, LY_STMT_REFERENCE, 0, &leaf->ref, Y_STR_ARG, NULL, &leaf->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &leaf->flags, &leaf->exts));
            break;
        case LY_STMT_TYPE:
            LY_CHECK_RET(parse_type(ctx, &leaf->type));
            break;
        case LY_STMT_UNITS:
            LY_CHECK_RET(parse_text_field(ctx, leaf->units, LY_STMT_UNITS, 0, &leaf->units, Y_STR_ARG, NULL, &leaf->exts));
            break;
        case LY_STMT_WHEN:
            LY_CHECK_RET(parse_when(ctx, &leaf->when));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, leaf, LY_STMT_LEAF, 0, &leaf->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "leaf");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, leaf->exts, ret, cleanup);
    }

    /* mandatory substatements */
    if (!leaf->type.name) {
        LOGVAL_PARSER(ctx, LY_VCODE_MISSTMT, "type", "leaf");
        return LY_EVALID;
    }

cleanup:
    return ret;
}